

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool anon_unknown.dwarf_22bf96::HasSideEffects(VmInstructionType cmd)

{
  if (((0x32 < cmd - VM_INST_SET_RANGE) ||
      ((0x46000000000ffU >> ((ulong)(cmd - VM_INST_SET_RANGE) & 0x3f) & 1) == 0)) &&
     (6 < cmd - VM_INST_STORE_BYTE)) {
    return false;
  }
  return true;
}

Assistant:

bool HasSideEffects(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
		case VM_INST_SET_RANGE:
		case VM_INST_MEM_COPY:
		case VM_INST_JUMP:
		case VM_INST_JUMP_Z:
		case VM_INST_JUMP_NZ:
		case VM_INST_CALL:
		case VM_INST_RETURN:
		case VM_INST_YIELD:
		case VM_INST_UNYIELD:
		case VM_INST_CONVERT_POINTER:
		case VM_INST_ABORT_NO_RETURN:
			return true;
		default:
			break;
		}

		return false;
	}